

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O0

void __thiscall ReconnectingHub::stepAndReconnect(ReconnectingHub *this)

{
  ReconnectingHub *this_local;
  
  Dashel::Hub::step((int)this);
  if ((this->connected & 1U) == 0) {
    connectToTarget(this);
  }
  return;
}

Assistant:

void stepAndReconnect()
	{
		// first step
		step(1000);
		// if disconnected...
		if (!connected)
		{
			// ...attempt to reconnect
			connectToTarget();
		}
	}